

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

string * __thiscall FIX::Message::toXML_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  Message *this_local;
  string *str;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  toXML(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string Message::toXML() const
{
  std::string str;
  toXML( str );
  return str;
}